

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

format_arg * __thiscall
fmt::v8::detail::specs_handler<char8_t>::get_arg
          (format_arg *__return_storage_ptr__,specs_handler<char8_t> *this)

{
  buffer_context<char8_t> *this_00;
  uint uVar1;
  buffer_context<char8_t> *pbVar2;
  specs_handler<char8_t> *this_local;
  
  this_00 = this->context_;
  pbVar2 = this_00;
  uVar1 = basic_format_parse_context<char8_t,_fmt::v8::detail::error_handler>::next_arg_id
                    (this->parse_context_);
  get_arg<fmt::v8::basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>>,char8_t>,int>
            (__return_storage_ptr__,(detail *)this_00,
             (basic_format_context<std::back_insert_iterator<fmt::v8::detail::buffer<char8_t>_>,_char8_t>
              *)(ulong)uVar1,(int)pbVar2);
  return __return_storage_ptr__;
}

Assistant:

FMT_CONSTEXPR auto get_arg(auto_id) -> format_arg {
    return detail::get_arg(context_, parse_context_.next_arg_id());
  }